

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

int bf_write(bfile_t *bfile,uint8_t *buffer,uint len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  while (uVar1 = len - uVar4, uVar4 <= len && uVar1 != 0) {
    uVar3 = (ulong)bfile->buffer_size;
    if (bfile->pos - bfile->ipos < uVar3) {
      uVar2 = bfile->pos % uVar3;
      uVar3 = uVar3 - uVar2;
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      memcpy(bfile->buffer + uVar2,buffer + uVar4,uVar3);
      uVar4 = uVar4 + uVar3;
      bfile->pos = bfile->pos + uVar3;
    }
    else {
      bf_write_buffer(bfile);
    }
  }
  return (int)uVar4;
}

Assistant:

int
bf_write(
    bfile_t * bfile,
    uint8_t * buffer,
    unsigned int len )
{
    size_t haswritten, towrite;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    haswritten = 0;
    towrite = len;
    while ( haswritten < towrite ) {
        if ( (bfile->pos - bfile->ipos) < bfile->buffer_size ) {
            size_t bufoff, cpylen;
            bufoff = bfile->pos % bfile->buffer_size;
            cpylen = PRF_MIN( (bfile->buffer_size - bufoff), (towrite - haswritten) );
            memcpy( bfile->buffer + bufoff, buffer + haswritten, cpylen );
            haswritten += cpylen;
            bfile->pos += cpylen;
        } else {
            bf_write_buffer( bfile );
        }
    }

    return (int)haswritten;
}